

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_solid_clear(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint32_t uVar1;
  int local_24;
  int i;
  uint32_t ialpha;
  uint32_t const_alpha_local;
  uint32_t color_local;
  int length_local;
  uint32_t *dest_local;
  
  if (const_alpha == 0xff) {
    plutovg_memfill32(dest,length,0);
  }
  else {
    for (local_24 = 0; local_24 < length; local_24 = local_24 + 1) {
      uVar1 = BYTE_MUL(dest[local_24],0xff - const_alpha);
      dest[local_24] = uVar1;
    }
  }
  return;
}

Assistant:

static void composition_solid_clear(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        plutovg_memfill32(dest, length, 0);
    } else {
        uint32_t ialpha = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            dest[i] = BYTE_MUL(dest[i], ialpha);
        }
    }
}